

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::minimal_simplex_with_same_filtration
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Simplex_handle *sh)

{
  double dVar1;
  Simplex_handle SVar2;
  Filtration_value *pFVar3;
  undefined8 *in_RDX;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  __begin0;
  Simplex_handle local_2a8;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *local_2a0;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_298;
  Simplex_handle local_290;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  local_288;
  Boundary_simplex_range local_1c0;
  
  local_290.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)*in_RDX;
  pFVar3 = filtration_(&local_290);
  dVar1 = *pFVar3;
  local_298.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)*in_RDX;
  boundary_simplex_range<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>>
            (&local_1c0,(Simplex_tree<Gudhi::Simplex_tree_options_default> *)sh,&local_298);
  local_288.last_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.last_;
  local_288.next_ =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.next_;
  local_288.suffix_.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size =
       local_1c0.
       super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.suffix_.
       super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
       .m_holder.m_size;
  if (local_1c0.
      super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.suffix_.
      super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
      .m_holder.m_size < 0x29) {
    if (local_1c0.
        super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin.suffix_.
        super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
        .m_holder.m_size != 0) {
      memcpy(&local_288.suffix_,
             &local_1c0.
              super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin.suffix_,
             local_1c0.
             super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.suffix_.
             super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
             .m_holder.m_size << 2);
    }
    local_288.sib_ =
         local_1c0.
         super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin.sib_;
    local_288.sh_.m_ptr =
         local_1c0.
         super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin.sh_.m_ptr;
    local_288.st_ =
         local_1c0.
         super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin.st_;
    if (local_1c0.
        super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
        .m_End.suffix_.
        super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
        .m_holder.m_size < 0x29) {
      if (local_1c0.
          super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.sh_.m_ptr !=
          local_1c0.
          super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End.sh_.m_ptr) {
        do {
          SVar2.m_ptr = local_288.sh_.m_ptr;
          if (local_288.sh_.m_ptr ==
              (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
               *)0x0) {
            __assert_fail("sh_ != st_->null_simplex()",
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree/Simplex_tree_iterators.h"
                          ,0x8a,
                          "const Simplex_handle &Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<>>::dereference() const [SimplexTree = Gudhi::Simplex_tree<>]"
                         );
          }
          local_2a8.m_ptr = local_288.sh_.m_ptr;
          pFVar3 = filtration_(&local_2a8);
          if ((*pFVar3 == dVar1) && (!NAN(*pFVar3) && !NAN(dVar1))) {
            local_2a0 = SVar2.m_ptr;
            minimal_simplex_with_same_filtration(this,sh);
            return (Simplex_handle)
                   (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                    *)this;
          }
          Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
          ::increment(&local_288);
        } while (local_288.sh_.m_ptr !=
                 local_1c0.
                 super_iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
                 .m_End.sh_.m_ptr);
      }
      (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)*in_RDX;
      return (Simplex_handle)
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
              *)this;
    }
  }
  boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::on_capacity_overflow();
}

Assistant:

Simplex_handle minimal_simplex_with_same_filtration(Simplex_handle sh) const {
    auto filt = filtration_(sh);
    // Naive implementation, it can be sped up.
    for(auto b : boundary_simplex_range(sh))
      if(filtration_(b) == filt)
        return minimal_simplex_with_same_filtration(b);
    return sh; // None of its faces has the same filtration.
  }